

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BSTree.hpp
# Opt level: O1

void __thiscall BSTree<int>::print(BSTree<int> *this,BSTNode<int> *tree,int key,int direction)

{
  ostream *this_00;
  ulong uVar1;
  char *pcVar2;
  
  for (; tree != (BSTNode<int> *)0x0; tree = tree->right) {
    *(undefined8 *)(memmove + *(long *)(std::cout + -0x18)) = 2;
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,tree->key);
    if (direction == 0) {
      uVar1 = 8;
      pcVar2 = " is root";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(this_00," is ",4);
      *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 2;
      this_00 = (ostream *)std::ostream::operator<<(this_00,key);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,"\'s ",3);
      *(undefined8 *)(this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 0xc;
      pcVar2 = "left child";
      if (direction == 1) {
        pcVar2 = "right child";
      }
      uVar1 = (ulong)(direction == 1) | 10;
    }
    std::__ostream_insert<char,std::char_traits<char>>(this_00,pcVar2,uVar1);
    std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    print(this,tree->left,tree->key,-1);
    key = tree->key;
    direction = 1;
  }
  return;
}

Assistant:

void BSTree<T>::print(BSTNode<T>* tree, T key, int direction)
{
	if (tree != nullptr) {
		if (direction == 0) {
			std::cout << std::setw(2) << tree->key << " is root" << std::endl;

		} else {
			std::cout << std::setw(2) << tree->key << " is " << std::setw(2)
			<< key << "'s " << std::setw(12) << (direction == 1 ? "right child" : "left child") << std::endl;
		}

		print(tree->left, tree->key, -1);
		print(tree->right, tree->key, 1);
	}
}